

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O2

void __thiscall BossaObserver::onProgress(BossaObserver *this,int num,int div)

{
  undefined4 in_register_00000034;
  int iVar1;
  ulong uVar2;
  
  uVar2 = (long)(num * 0x1e) / (long)div;
  if ((int)uVar2 != this->_lastTicks) {
    printf("\r[",CONCAT44(in_register_00000034,num),(long)(num * 0x1e) % (long)div & 0xffffffff);
    iVar1 = 0x1e;
    for (uVar2 = uVar2 & 0xffffffff; 0 < (int)uVar2; uVar2 = (ulong)((int)uVar2 - 1)) {
      putchar(0x3d);
      iVar1 = iVar1 + -1;
    }
    for (; 0 < iVar1; iVar1 = iVar1 + -1) {
      putchar(0x20);
    }
    printf("] %d%% (%d/%d pages)",(long)(num * 100) / (long)div & 0xffffffff,(ulong)(uint)num,
           (ulong)(uint)div);
    fflush(_stdout);
    this->_lastTicks = 0;
  }
  return;
}

Assistant:

void
BossaObserver::onProgress(int num, int div)
{
    int ticks;
    int bars = 30;

    ticks = num * bars / div;
    
    if (ticks == _lastTicks)
        return;
    
    printf("\r[");
    while (ticks-- > 0)
    {
        putchar('=');
        bars--;
    }
    while (bars-- > 0)
    {
        putchar(' ');
    }
    printf("] %d%% (%d/%d pages)", num * 100 / div, num, div);
    fflush(stdout);
    
    _lastTicks = 0;
}